

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O1

void mserialize::detail::visit_impl<(anonymous_namespace)::StoreT<long>,InputStream>
               (string_view full_tag,string_view tag,StoreT<long> *visitor,InputStream *istream,
               int max_recursion)

{
  byte __rhs;
  code *pcVar1;
  double dVar2;
  int iVar3;
  StoreT<long> *visitor_00;
  int iVar4;
  char extraout_AL;
  bool bVar5;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  char extraout_AL_03;
  char extraout_AL_04;
  char extraout_AL_05;
  char extraout_AL_06;
  char extraout_AL_07;
  char extraout_AL_08;
  char extraout_AL_09;
  char extraout_AL_10;
  char extraout_AL_11;
  char extraout_AL_12;
  char extraout_AL_13;
  char extraout_AL_14;
  char extraout_AL_15;
  char extraout_AL_16;
  char extraout_AL_17;
  char extraout_AL_18;
  char extraout_AL_19;
  char extraout_AL_20;
  char extraout_AL_21;
  char extraout_AL_22;
  char extraout_AL_23;
  char extraout_AL_24;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  long *plVar10;
  runtime_error *prVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t extraout_RDX_04;
  size_t extraout_RDX_05;
  char *pcVar13;
  char cVar14;
  detail *pdVar15;
  ulong uVar16;
  long lVar17;
  detail *pdVar18;
  detail *in_R10;
  ulong uVar19;
  int iVar20;
  detail *pdVar21;
  byte *pbVar22;
  ulong uVar23;
  char *pcVar24;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Da_15;
  undefined4 extraout_XMM0_Da_16;
  undefined4 extraout_XMM0_Da_17;
  undefined4 extraout_XMM0_Da_18;
  undefined4 extraout_XMM0_Da_19;
  undefined4 extraout_XMM0_Da_20;
  undefined4 extraout_XMM0_Da_21;
  undefined4 extraout_XMM0_Da_22;
  undefined4 extraout_XMM0_Da_23;
  undefined4 extraout_XMM0_Da_24;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Db_17;
  undefined4 extraout_XMM0_Db_18;
  undefined4 extraout_XMM0_Db_19;
  undefined4 extraout_XMM0_Db_20;
  undefined4 extraout_XMM0_Db_21;
  undefined4 extraout_XMM0_Db_22;
  undefined4 extraout_XMM0_Db_23;
  undefined4 extraout_XMM0_Db_24;
  string_view full_tag_00;
  string_view full_tag_01;
  string_view full_tag_02;
  string_view full_tag_03;
  string_view full_tag_04;
  string_view full_tag_05;
  string_view tag_00;
  string_view tag_01;
  string_view tag_02;
  string_view tag_03;
  string_view tag_04;
  string_view tag_05;
  string_view tags;
  string_view tags_00;
  string_view tags_01;
  string_view tags_02;
  string_view tags_03;
  string_view tags_04;
  uint8_t discriminator;
  int64_t l;
  undefined1 local_d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  ostream *local_a8;
  int local_9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  ulong local_78;
  StoreT<long> *local_70;
  detail *local_68;
  InputStream *local_60;
  ExpressionDecomposer local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  size_t extraout_RDX_03;
  
  uVar7 = tag._len;
  pbVar22 = (byte *)tag._ptr;
  local_78 = full_tag._len;
  full_tag_00._ptr = (detail *)full_tag._ptr;
  if (max_recursion == 0) {
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,full_tag_00._ptr,full_tag_00._ptr + local_78);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                   "Recursion limit exceeded while visiting tag: ",&local_98);
    std::runtime_error::runtime_error(prVar11,(string *)local_d0);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (uVar7 == 0) {
    return;
  }
  __rhs = *pbVar22;
  pdVar21 = (detail *)(ulong)__rhs;
  if (__rhs < 0x3c) {
    if (__rhs == 0x28) {
      pcVar13 = (char *)0x0;
      if (uVar7 != 1) {
        pcVar13 = (char *)(uVar7 - 2);
      }
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x2b,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
      if (extraout_AL_05 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      pdVar21 = (detail *)(pbVar22 + 1);
      doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d0);
      tags_02._len = extraout_RDX_02;
      tags_02._ptr = pcVar13;
      pcVar9 = (char *)tag_first_size(pdVar21,tags_02);
      uVar7 = local_78;
      local_9c = max_recursion;
      if (pcVar9 != (char *)0x0) {
        local_9c = max_recursion + -1;
        pcVar24 = pcVar9;
        if (pcVar13 < pcVar9) {
          pcVar24 = pcVar13;
        }
        pcVar13 = pcVar13 + -(long)pcVar24;
        pdVar15 = (detail *)(pcVar24 + (long)pdVar21);
        do {
          pdVar18 = pdVar15;
          full_tag_03._len = uVar7;
          full_tag_03._ptr = (char *)full_tag_00._ptr;
          tag_03._len = (size_t)pcVar9;
          tag_03._ptr = (char *)pdVar21;
          visit_impl<(anonymous_namespace)::StoreT<long>,InputStream>
                    (full_tag_03,tag_03,visitor,istream,local_9c);
          tags_03._len = extraout_RDX_03;
          tags_03._ptr = pcVar13;
          pcVar9 = (char *)tag_first_size(pdVar18,tags_03);
          pcVar24 = pcVar9;
          if (pcVar13 < pcVar9) {
            pcVar24 = pcVar13;
          }
          pcVar13 = pcVar13 + -(long)pcVar24;
          pdVar15 = pdVar18 + (long)pcVar24;
          pdVar21 = pdVar18;
        } while (pcVar9 != (char *)0x0);
      }
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06));
      if (extraout_AL_06 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      goto LAB_0014f1fa;
    }
    if (__rhs == 0x2f) {
      pbVar22 = pbVar22 + 1;
      if (uVar7 < 3) {
        lVar17 = 0;
        if (uVar7 != 1) {
          lVar17 = uVar7 - 2;
        }
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,pbVar22,pbVar22 + lVar17);
        std::operator+(&local_98,"Invalid enum tag: \'",&local_50);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_98);
        local_d0._0_8_ = *plVar10;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._0_8_ == paVar12) {
          local_c0._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_c0._8_8_ = plVar10[3];
          local_d0._0_8_ = &local_c0;
        }
        else {
          local_c0._M_allocated_capacity = paVar12->_M_allocated_capacity;
        }
        local_d0._8_8_ = plVar10[1];
        *plVar10 = (long)paVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::runtime_error::runtime_error(prVar11,(string *)local_d0);
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_98.field_2._8_8_ = local_98.field_2._M_local_buf + 3;
      visit_arithmetic<mserialize::detail::IntegerToHex,InputStream>
                (*pbVar22,(IntegerToHex *)&local_98,istream);
      *(char *)(local_98.field_2._8_8_ + -1) = '\'';
      local_98.field_2._M_local_buf[3] = '`';
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
      if (extraout_AL_02 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      goto LAB_0014f1fa;
    }
  }
  else {
    if (__rhs == 0x3c) {
      pdVar21 = (detail *)(pbVar22 + 1);
      pcVar13 = (char *)0x0;
      if (uVar7 != 1) {
        pcVar13 = (char *)(uVar7 - 2);
      }
      local_68 = full_tag_00._ptr;
      std::istream::read((char *)istream->stream,(long)&local_98);
      sVar6 = extraout_RDX_00;
      for (cVar14 = (char)local_98._M_dataplus._M_p; cVar14 != '\0'; cVar14 = cVar14 + -1) {
        tags_00._len = sVar6;
        tags_00._ptr = pcVar13;
        pcVar9 = (char *)tag_first_size(pdVar21,tags_00);
        if (pcVar13 < pcVar9) {
          pcVar9 = pcVar13;
        }
        pdVar21 = pdVar21 + (long)pcVar9;
        pcVar13 = pcVar13 + -(long)pcVar9;
        sVar6 = extraout_RDX_01;
      }
      tags_01._len = sVar6;
      tags_01._ptr = pcVar13;
      sVar6 = tag_first_size(pdVar21,tags_01);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x2b,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      uVar7 = local_78;
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
      if (extraout_AL_03 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d0);
      if ((sVar6 == 1) && (iVar20 = bcmp(pdVar21,"0",1), iVar20 == 0)) {
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
        dVar2 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d0,
                           (double)CONCAT44(extraout_XMM0_Db_14,extraout_XMM0_Da_14));
        if (extraout_AL_14 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
        doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d0);
      }
      else {
        full_tag_02._len = uVar7;
        full_tag_02._ptr = (char *)local_68;
        tag_02._len = sVar6;
        tag_02._ptr = (char *)pdVar21;
        visit_impl<(anonymous_namespace)::StoreT<long>,InputStream>
                  (full_tag_02,tag_02,visitor,istream,max_recursion + -1);
      }
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
      if (extraout_AL_04 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      goto LAB_0014f1fa;
    }
    if (__rhs == 0x7b) {
      uVar23 = uVar7 - 1;
      if (uVar7 == 0) {
        uVar23 = 0;
      }
      uVar8 = 0;
      if (uVar7 - 1 != 0) {
        uVar7 = 0;
        do {
          uVar8 = uVar7;
          if (pbVar22[uVar7] == 0x60) break;
          uVar7 = uVar7 + 1;
          uVar8 = uVar23;
        } while (uVar23 != uVar7);
      }
      uVar7 = uVar8;
      if (uVar23 < uVar8) {
        uVar7 = uVar23;
      }
      uVar23 = uVar23 - uVar7;
      if (uVar23 == 0) {
        uVar7 = local_78;
        pdVar15 = full_tag_00._ptr;
        if (uVar8 != 0) {
          do {
            if (uVar7 == 0) goto LAB_0014f02e;
            uVar16 = uVar7;
            pdVar18 = pdVar15;
            do {
              uVar19 = 0;
              do {
                if (uVar16 == uVar19) {
                  bVar5 = false;
                  in_R10 = pdVar15 + uVar7;
                  goto LAB_0014ef8b;
                }
                if (pdVar18[uVar19] != *(detail *)(pbVar22 + uVar19)) {
                  bVar5 = true;
                  goto LAB_0014ef8b;
                }
                uVar19 = uVar19 + 1;
              } while (uVar8 != uVar19);
              bVar5 = false;
              in_R10 = pdVar18;
LAB_0014ef8b:
              pdVar18 = pdVar18 + 1;
              uVar16 = uVar16 - 1;
            } while (bVar5);
            uVar16 = (long)in_R10 - (long)pdVar15;
            if (in_R10 == pdVar15 + uVar7) {
              uVar16 = 0xffffffffffffffff;
            }
            if (uVar7 < uVar16) {
              uVar16 = uVar7;
            }
            uVar7 = uVar7 - uVar16;
            uVar19 = uVar8;
            if (uVar7 < uVar8) {
              uVar19 = uVar7;
            }
            pdVar15 = pdVar15 + uVar19 + uVar16;
            iVar20 = 3;
            uVar7 = uVar7 - uVar19;
            if ((uVar7 != 0) && (*pdVar15 != (detail)0x7d)) {
              if (*pdVar15 == (detail)0x60) {
                iVar20 = 1;
                pdVar21 = pdVar15;
                if (uVar7 == 1) {
                  uVar23 = 0;
                }
                else {
                  uVar23 = 1;
                  lVar17 = 1;
                  do {
                    if (pdVar15[uVar23] == (detail)0x7d) {
                      lVar17 = lVar17 + -1;
                      if (lVar17 == 0) goto LAB_0014f021;
                    }
                    else if (pdVar15[uVar23] == (detail)0x7b) {
                      lVar17 = lVar17 + 1;
                    }
                    uVar23 = uVar23 + 1;
                  } while (uVar7 != uVar23);
                  uVar23 = uVar7 - 1;
                }
              }
              else {
                iVar20 = 0;
              }
            }
LAB_0014f021:
          } while (iVar20 == 0);
          if (iVar20 == 1) goto LAB_0014f033;
        }
LAB_0014f02e:
        pdVar21 = (detail *)0x0;
        uVar23 = 0;
      }
      else {
        pdVar21 = (detail *)(pbVar22 + uVar7);
      }
LAB_0014f033:
      local_70 = visitor;
      local_68 = full_tag_00._ptr;
      local_60 = istream;
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x2b,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_10,extraout_XMM0_Da_10));
      if (extraout_AL_10 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d0);
      if (uVar23 != 0) {
        sVar6 = extraout_RDX_04;
        do {
          uVar23 = uVar23 - 1;
          if (uVar23 == 0) {
            uVar7 = 1;
          }
          else {
            uVar8 = 0;
            do {
              uVar7 = uVar8;
              if (pdVar21[uVar8 + 1] == (detail)0x27) break;
              uVar8 = uVar8 + 1;
              uVar7 = uVar23;
            } while (uVar23 != uVar8);
            uVar7 = uVar7 + 1;
          }
          if (uVar23 < uVar7) {
            uVar7 = uVar23;
          }
          pdVar21 = pdVar21 + uVar7 + 1;
          pcVar24 = (char *)(uVar23 - uVar7);
          tags_04._len = sVar6;
          tags_04._ptr = pcVar24;
          pcVar9 = (char *)tag_first_size(pdVar21,tags_04);
          pcVar13 = pcVar9;
          if (pcVar24 < pcVar9) {
            pcVar13 = pcVar24;
          }
          doctest::detail::MessageBuilder::MessageBuilder
                    ((MessageBuilder *)local_d0,
                     "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                     ,0x28,is_require);
          std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
          dVar2 = doctest::detail::MessageBuilder::log
                            ((MessageBuilder *)local_d0,
                             (double)CONCAT44(extraout_XMM0_Db_11,extraout_XMM0_Da_11));
          if (extraout_AL_11 != '\0') {
            pcVar1 = (code *)swi(3);
            (*pcVar1)(SUB84(dVar2,0));
            return;
          }
          doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
          doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d0);
          full_tag_05._len = local_78;
          full_tag_05._ptr = (char *)local_68;
          tag_05._len = (size_t)pcVar9;
          tag_05._ptr = (char *)pdVar21;
          visit_impl<(anonymous_namespace)::StoreT<long>,InputStream>
                    (full_tag_05,tag_05,local_70,local_60,max_recursion + -1);
          doctest::detail::MessageBuilder::MessageBuilder
                    ((MessageBuilder *)local_d0,
                     "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                     ,0x28,is_require);
          std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
          dVar2 = doctest::detail::MessageBuilder::log
                            ((MessageBuilder *)local_d0,
                             (double)CONCAT44(extraout_XMM0_Db_12,extraout_XMM0_Da_12));
          if (extraout_AL_12 != '\0') {
            pcVar1 = (code *)swi(3);
            (*pcVar1)(SUB84(dVar2,0));
            return;
          }
          doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
          pdVar21 = pdVar21 + (long)pcVar13;
          uVar23 = (long)pcVar24 - (long)pcVar13;
          doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d0);
          sVar6 = extraout_RDX_05;
        } while (uVar23 != 0);
      }
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_13,extraout_XMM0_Da_13));
      if (extraout_AL_13 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      goto LAB_0014f1fa;
    }
    if (__rhs == 0x5b) {
      pdVar21 = (detail *)(pbVar22 + 1);
      local_70 = visitor;
      std::istream::read((char *)istream->stream,(long)&local_98);
      tags._len = extraout_RDX;
      tags._ptr = (char *)(uVar7 - 1);
      sVar6 = tag_first_size(pdVar21,tags);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x2b,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      uVar7 = local_78;
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      if (extraout_AL != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      iVar20 = max_recursion + -1;
      doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d0);
      if (((uint)local_98._M_dataplus._M_p < 0x21) ||
         (full_tag_00._len = uVar7, tag_00._len = sVar6, tag_00._ptr = (char *)pdVar21,
         bVar5 = singular_impl(full_tag_00,tag_00,iVar20), !bVar5)) {
        visitor_00 = local_70;
        iVar3 = (uint)local_98._M_dataplus._M_p;
        local_98._M_dataplus._M_p._0_4_ = (uint)local_98._M_dataplus._M_p + -1;
        iVar4 = local_9c;
        while (local_9c = iVar20, iVar3 != 0) {
          full_tag_04._len = uVar7;
          full_tag_04._ptr = (char *)full_tag_00._ptr;
          tag_04._len = sVar6;
          tag_04._ptr = (char *)pdVar21;
          visit_impl<(anonymous_namespace)::StoreT<long>,InputStream>
                    (full_tag_04,tag_04,visitor_00,istream,local_9c);
          iVar3 = (uint)local_98._M_dataplus._M_p;
          local_98._M_dataplus._M_p._0_4_ = (uint)local_98._M_dataplus._M_p + -1;
          iVar20 = local_9c;
          iVar4 = local_9c;
        }
      }
      else {
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        uVar7 = local_78;
        std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
        dVar2 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d0,
                           (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
        if (extraout_AL_00 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
        doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d0);
        full_tag_01._len = uVar7;
        full_tag_01._ptr = (char *)full_tag_00._ptr;
        tag_01._len = sVar6;
        tag_01._ptr = (char *)pdVar21;
        visit_impl<(anonymous_namespace)::StoreT<long>,InputStream>
                  (full_tag_01,tag_01,local_70,istream,iVar20);
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
        dVar2 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d0,
                           (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
        if (extraout_AL_01 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
        doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d0);
        iVar4 = local_9c;
      }
      local_9c = iVar4;
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08));
      if (extraout_AL_08 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      goto LAB_0014f1fa;
    }
  }
  if (__rhs < 0x62) {
    if (__rhs < 0x49) {
      if (__rhs == 0x42) {
        std::istream::read((char *)istream->stream,(long)&local_98);
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
        dVar2 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d0,
                           (double)CONCAT44(extraout_XMM0_Db_23,extraout_XMM0_Da_23));
        if (extraout_AL_23 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      }
      else {
        if (__rhs != 0x44) goto switchD_0014eda5_caseD_65;
        std::istream::read((char *)istream->stream,(long)&local_98);
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
        dVar2 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d0,
                           (double)CONCAT44(extraout_XMM0_Db_16,extraout_XMM0_Da_16));
        if (extraout_AL_16 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      }
    }
    else if (__rhs == 0x49) {
      std::istream::read((char *)istream->stream,(long)&local_98);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_22,extraout_XMM0_Da_22));
      if (extraout_AL_22 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
    }
    else if (__rhs == 0x4c) {
      std::istream::read((char *)istream->stream,(long)&local_98);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_21,extraout_XMM0_Da_21));
      if (extraout_AL_21 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
    }
    else {
      if (__rhs != 0x53) goto switchD_0014eda5_caseD_65;
      std::istream::read((char *)istream->stream,(long)&local_98);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_09,extraout_XMM0_Da_09));
      if (extraout_AL_09 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
    }
  }
  else {
    switch(__rhs) {
    case 0x62:
      std::istream::read((char *)istream->stream,(long)&local_98);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
      if (extraout_AL_07 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      break;
    case 99:
      std::istream::read((char *)istream->stream,(long)&local_98);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_18,extraout_XMM0_Da_18));
      if (extraout_AL_18 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      break;
    case 100:
      std::istream::read((char *)istream->stream,(long)&local_98);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_17,extraout_XMM0_Da_17));
      if (extraout_AL_17 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      break;
    case 0x65:
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
switchD_0014eda5_caseD_65:
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"Invalid arithmetic tag: ","");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     &local_98,__rhs);
      std::runtime_error::runtime_error(prVar11,(string *)local_d0);
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    case 0x66:
      std::istream::read((char *)istream->stream,(long)&local_98);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_19,extraout_XMM0_Da_19));
      if (extraout_AL_19 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      break;
    case 0x69:
      std::istream::read((char *)istream->stream,(long)&local_98);
      doctest::detail::MessageBuilder::MessageBuilder
                ((MessageBuilder *)local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                 ,0x28,is_require);
      std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
      dVar2 = doctest::detail::MessageBuilder::log
                        ((MessageBuilder *)local_d0,
                         (double)CONCAT44(extraout_XMM0_Db_20,extraout_XMM0_Da_20));
      if (extraout_AL_20 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      break;
    case 0x6c:
      std::istream::read((char *)istream->stream,(long)&local_50);
      doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_54,DT_CHECK);
      local_98._M_dataplus._M_p =
           (pointer)((ulong)local_54.m_at << 0x20 | (ulong)visitor->_has_visit ^ 1);
      doctest::detail::Expression_lhs::operator_cast_to_Result
                ((Result *)local_d0,(Expression_lhs *)&local_98);
      doctest::detail::decomp_assert
                ((detail *)0xa,0x1b93e8,(char *)0x22,0x1babc4,(char *)local_d0,(Result *)istream);
      doctest::String::~String((String *)(local_d0 + 8));
      visitor->_has_visit = true;
      visitor->_value = (long)local_50._M_dataplus._M_p;
      return;
    default:
      if (__rhs == 0x73) {
        std::istream::read((char *)istream->stream,(long)&local_98);
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
        dVar2 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d0,
                           (double)CONCAT44(extraout_XMM0_Db_24,extraout_XMM0_Da_24));
        if (extraout_AL_24 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      }
      else {
        if (__rhs != 0x79) goto switchD_0014eda5_caseD_65;
        std::istream::read((char *)istream->stream,(long)&local_98);
        doctest::detail::MessageBuilder::MessageBuilder
                  ((MessageBuilder *)local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/mserialize/visit.cpp"
                   ,0x28,is_require);
        std::__ostream_insert<char,std::char_traits<char>>(local_a8,"Unexpected visit of U",0x15);
        dVar2 = doctest::detail::MessageBuilder::log
                          ((MessageBuilder *)local_d0,
                           (double)CONCAT44(extraout_XMM0_Db_15,extraout_XMM0_Da_15));
        if (extraout_AL_15 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::MessageBuilder::react((MessageBuilder *)local_d0);
      }
    }
  }
LAB_0014f1fa:
  doctest::detail::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d0);
  return;
}

Assistant:

void visit_impl(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  if (max_recursion == 0) { throw std::runtime_error("Recursion limit exceeded while visiting tag: " + full_tag.to_string()); }

  if (tag.empty()) { return; }

  switch (tag.front())
  {
  case '[':
    visit_sequence(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '(':
    visit_tuple(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '<':
    visit_variant(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '{':
    visit_struct(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '/':
    visit_enum(tag, visitor, istream);
    break;
  default:
    visit_arithmetic(tag.front(), visitor, istream);
  }
}